

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::UniformCase::getActiveUniforms
          (UniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
          *basicUniformReportsDst,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,deUint32 programGL)

{
  int iVar1;
  GLint index;
  byte bVar2;
  undefined4 bufSize;
  __type _Var3;
  bool bVar4;
  GLenum GVar5;
  deBool dVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  reference pvVar8;
  TestError *this_01;
  char *pcVar9;
  size_type sVar10;
  const_reference __lhs;
  bool local_10bd;
  MessageBuilder local_f78;
  __normal_iterator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>_>
  local_df8;
  __normal_iterator<const_deqp::gles3::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>_>
  local_df0;
  const_reference local_de8;
  BasicUniformReportRef *expected;
  int i;
  byte local_db3;
  byte local_db2;
  byte local_db1;
  string local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  string local_d30;
  MessageBuilder local_d10;
  char *local_b90;
  MessageBuilder local_b88;
  BasicUniformReportGL local_a08;
  MessageBuilder local_9d8;
  __normal_iterator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>_>
  local_858;
  __normal_iterator<const_deqp::gles3::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>_>
  local_850;
  const_reference local_848;
  BasicUniformReportRef *reference;
  int local_6bc;
  unsigned_long uStack_6b8;
  int referenceNdx;
  MessageBuilder local_6b0;
  char *local_530;
  MessageBuilder local_528;
  allocator<char> local_3a1;
  undefined1 local_3a0 [8];
  string reportedNameStr;
  GLenum local_378;
  DataType reportedType;
  GLenum reportedTypeGL;
  GLint reportedSize;
  GLsizei reportedNameLength;
  int unifNdx;
  MessageBuilder local_1e8;
  byte local_51;
  undefined1 local_50 [7];
  bool success;
  vector<char,_std::allocator<char>_> nameBuffer;
  GLint uniformMaxNameLength;
  GLint numActiveUniforms;
  TestLog *log;
  deUint32 programGL_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
  *basicUniformReportsRef_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  *basicUniformReportsDst_local;
  UniformCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_50);
  local_51 = 1;
  do {
    glu::CallLogWrapper::glGetProgramiv
              (&this->super_CallLogWrapper,programGL,0x8b86,
               (GLint *)&nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x14);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                    ,0x5ba);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1e8,(char (*) [40])"// Number of active uniforms reported: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(int *)&nameBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.field_0x14);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  do {
    glu::CallLogWrapper::glGetProgramiv
              (&this->super_CallLogWrapper,programGL,0x8b87,
               (GLint *)&nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,
                    "glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                    ,0x5bc);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&reportedNameLength,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&reportedNameLength,
                      (char (*) [42])"// Maximum uniform name length reported: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(int *)&nameBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.field_0x10);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&reportedNameLength);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_50,
             (long)(int)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
  reportedSize = 0;
  do {
    if ((int)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ <=
        reportedSize) {
      for (expected._0_4_ = 0; iVar1 = (int)expected,
          sVar10 = std::
                   vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                   ::size(basicUniformReportsRef), bVar2 = local_51, iVar1 < (int)sVar10;
          expected._0_4_ = (int)expected + 1) {
        local_de8 = std::
                    vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                    ::operator[](basicUniformReportsRef,(long)(int)expected);
        local_10bd = false;
        if ((local_de8->isUsedInShader & 1U) != 0) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          local_df0._M_current =
               (BasicUniformReportGL *)
               BasicUniformReportGL::findWithName(basicUniformReportsDst,pcVar9);
          local_df8._M_current =
               (BasicUniformReportGL *)
               std::
               vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ::end(basicUniformReportsDst);
          local_10bd = __gnu_cxx::operator==(&local_df0,&local_df8);
        }
        if (local_10bd != false) {
          tcu::TestLog::operator<<(&local_f78,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_f78,(char (*) [31])"// FAILURE: uniform with name ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_de8->name);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])" was not reported by GL");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_f78);
          local_51 = 0;
        }
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_50);
      return (bool)(bVar2 & 1);
    }
    reportedTypeGL = 0;
    reportedType = ~TYPE_INVALID;
    local_378 = 0;
    do {
      bufSize = nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      index = reportedSize;
      pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_50,0);
      glu::CallLogWrapper::glGetActiveUniform
                (&this->super_CallLogWrapper,programGL,index,bufSize,(GLsizei *)&reportedTypeGL,
                 (GLint *)&reportedType,&local_378,pvVar8);
      GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar5,
                      "glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                      ,0x5c6);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    reportedNameStr.field_2._12_4_ = glu::getDataTypeFromGLType(local_378);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_50,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a0,pvVar8,&local_3a1);
    std::allocator<char>::~allocator(&local_3a1);
    do {
      dVar6 = ::deGetFalse();
      if ((dVar6 != 0) || (reportedNameStr.field_2._12_4_ == 0x5e)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid uniform type","reportedType != glu::TYPE_LAST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                   ,0x5cb);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    tcu::TestLog::operator<<(&local_528,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_528,(char (*) [15])"// Got name = ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3a0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])", name length = ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&reportedTypeGL);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])0x13092bd);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&reportedType);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])", type = ");
    local_530 = glu::getDataTypeName(reportedNameStr.field_2._12_4_);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_530);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_528);
    GVar5 = std::__cxx11::string::length();
    if (GVar5 != reportedTypeGL) {
      tcu::TestLog::operator<<(&local_6b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_6b0,
                          (char (*) [51])"// FAILURE: wrong name length reported, should be ");
      uStack_6b8 = std::__cxx11::string::length();
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xfffffffffffff948);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6b0);
      local_51 = 0;
    }
    pcVar9 = (char *)std::__cxx11::string::c_str();
    dVar6 = deStringBeginsWith(pcVar9,"gl_");
    if (dVar6 == 0) {
      for (local_6bc = 0; iVar1 = local_6bc,
          sVar10 = std::
                   vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                   ::size(basicUniformReportsRef), iVar1 < (int)sVar10; local_6bc = local_6bc + 1) {
        __lhs = std::
                vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                ::operator[](basicUniformReportsRef,(long)local_6bc);
        _Var3 = std::operator==(&__lhs->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3a0);
        if (_Var3) break;
      }
      iVar1 = local_6bc;
      sVar10 = std::
               vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
               ::size(basicUniformReportsRef);
      if (iVar1 < (int)sVar10) {
        local_848 = std::
                    vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
                    ::operator[](basicUniformReportsRef,(long)local_6bc);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        local_850._M_current =
             (BasicUniformReportGL *)
             BasicUniformReportGL::findWithName(basicUniformReportsDst,pcVar9);
        local_858._M_current =
             (BasicUniformReportGL *)
             std::
             vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             ::end(basicUniformReportsDst);
        bVar4 = __gnu_cxx::operator!=(&local_850,&local_858);
        if (bVar4) {
          tcu::TestLog::operator<<(&local_9d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_9d8,
                              (char (*) [45])"// FAILURE: same uniform name reported twice");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_9d8);
          local_51 = 0;
        }
        pcVar9 = (char *)std::__cxx11::string::c_str();
        BasicUniformReportGL::BasicUniformReportGL
                  (&local_a08,pcVar9,reportedTypeGL,reportedType,reportedNameStr.field_2._12_4_,
                   reportedSize);
        std::
        vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
        ::push_back(basicUniformReportsDst,&local_a08);
        BasicUniformReportGL::~BasicUniformReportGL(&local_a08);
        if (reportedNameStr.field_2._12_4_ != local_848->type) {
          tcu::TestLog::operator<<(&local_b88,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_b88,
                              (char (*) [44])"// FAILURE: wrong type reported, should be ");
          local_b90 = glu::getDataTypeName(local_848->type);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b90);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_b88);
          local_51 = 0;
        }
        if (((int)reportedType < local_848->minSize) || (local_848->maxSize < (int)reportedType)) {
          tcu::TestLog::operator<<(&local_d10,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_d10,
                              (char (*) [44])"// FAILURE: wrong size reported, should be ");
          local_db1 = 0;
          local_db2 = 0;
          local_db3 = 0;
          expected._7_1_ = 0;
          expected._6_1_ = 0;
          if (local_848->minSize == local_848->maxSize) {
            de::toString<int>(&local_d30,&local_848->minSize);
          }
          else {
            de::toString<int>(&local_db0,&local_848->minSize);
            local_db1 = 1;
            std::operator+(&local_d90,"in the range [",&local_db0);
            local_db2 = 1;
            std::operator+(&local_d70,&local_d90,", ");
            local_db3 = 1;
            de::toString<int>((string *)&i,&local_848->maxSize);
            expected._7_1_ = 1;
            std::operator+(&local_d50,&local_d70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            expected._6_1_ = 1;
            std::operator+(&local_d30,&local_d50,"]");
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_d30);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_d30);
          if ((expected._6_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_d50);
          }
          if ((expected._7_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&i);
          }
          if ((local_db3 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_d70);
          }
          if ((local_db2 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_d90);
          }
          if ((local_db1 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_db0);
          }
          tcu::MessageBuilder::~MessageBuilder(&local_d10);
          local_51 = 0;
        }
      }
      else {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&reference,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
        ;
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&reference,
                            (char (*) [55])"// FAILURE: invalid non-built-in uniform name reported")
        ;
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&reference);
        local_51 = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_3a0);
    reportedSize = reportedSize + 1;
  } while( true );
}

Assistant:

bool UniformCase::getActiveUniforms (vector<BasicUniformReportGL>& basicUniformReportsDst, const vector<BasicUniformReportRef>& basicUniformReportsRef, const deUint32 programGL)
{
	TestLog&			log						= m_testCtx.getLog();
	GLint				numActiveUniforms		= 0;
	GLint				uniformMaxNameLength	= 0;
	vector<char>		nameBuffer;
	bool				success					= true;

	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms));
	log << TestLog::Message << "// Number of active uniforms reported: " << numActiveUniforms << TestLog::EndMessage;
	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength));
	log << TestLog::Message << "// Maximum uniform name length reported: " << uniformMaxNameLength << TestLog::EndMessage;
	nameBuffer.resize(uniformMaxNameLength);

	for (int unifNdx = 0; unifNdx < numActiveUniforms; unifNdx++)
	{
		GLsizei					reportedNameLength	= 0;
		GLint					reportedSize		= -1;
		GLenum					reportedTypeGL		= GL_NONE;

		GLU_CHECK_CALL(glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0]));

		const glu::DataType		reportedType		= glu::getDataTypeFromGLType(reportedTypeGL);
		const string			reportedNameStr		(&nameBuffer[0]);

		TCU_CHECK_MSG(reportedType != glu::TYPE_LAST, "Invalid uniform type");

		log << TestLog::Message << "// Got name = " << reportedNameStr << ", name length = " << reportedNameLength << ", size = " << reportedSize << ", type = " << glu::getDataTypeName(reportedType) << TestLog::EndMessage;

		if ((GLsizei)reportedNameStr.length() != reportedNameLength)
		{
			log << TestLog::Message << "// FAILURE: wrong name length reported, should be " << reportedNameStr.length() << TestLog::EndMessage;
			success = false;
		}

		if (!deStringBeginsWith(reportedNameStr.c_str(), "gl_")) // Ignore built-in uniforms.
		{
			int referenceNdx;
			for (referenceNdx = 0; referenceNdx < (int)basicUniformReportsRef.size(); referenceNdx++)
			{
				if (basicUniformReportsRef[referenceNdx].name == reportedNameStr)
					break;
			}

			if (referenceNdx >= (int)basicUniformReportsRef.size())
			{
				log << TestLog::Message << "// FAILURE: invalid non-built-in uniform name reported" << TestLog::EndMessage;
				success = false;
			}
			else
			{
				const BasicUniformReportRef& reference = basicUniformReportsRef[referenceNdx];

				DE_ASSERT(reference.type != glu::TYPE_LAST);
				DE_ASSERT(reference.minSize >= 1 || (reference.minSize == 0 && !reference.isUsedInShader));
				DE_ASSERT(reference.minSize <= reference.maxSize);

				if (BasicUniformReportGL::findWithName(basicUniformReportsDst, reportedNameStr.c_str()) != basicUniformReportsDst.end())
				{
					log << TestLog::Message << "// FAILURE: same uniform name reported twice" << TestLog::EndMessage;
					success = false;
				}

				basicUniformReportsDst.push_back(BasicUniformReportGL(reportedNameStr.c_str(), reportedNameLength, reportedSize, reportedType, unifNdx));

				if (reportedType != reference.type)
				{
					log << TestLog::Message << "// FAILURE: wrong type reported, should be " << glu::getDataTypeName(reference.type) << TestLog::EndMessage;
					success = false;
				}
				if (reportedSize < reference.minSize || reportedSize > reference.maxSize)
				{
					log << TestLog::Message
						<< "// FAILURE: wrong size reported, should be "
						<< (reference.minSize == reference.maxSize ? de::toString(reference.minSize) : "in the range [" + de::toString(reference.minSize) + ", " + de::toString(reference.maxSize) + "]")
						<< TestLog::EndMessage;

					success = false;
				}
			}
		}
	}

	for (int i = 0; i < (int)basicUniformReportsRef.size(); i++)
	{
		const BasicUniformReportRef& expected = basicUniformReportsRef[i];
		if (expected.isUsedInShader && BasicUniformReportGL::findWithName(basicUniformReportsDst, expected.name.c_str()) == basicUniformReportsDst.end())
		{
			log << TestLog::Message << "// FAILURE: uniform with name " << expected.name << " was not reported by GL" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}